

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::setLeaveBound4Col(SPxSolverBase<double> *this,int i,int n)

{
  double dVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined4 uVar3;
  undefined4 uVar4;
  
  switch((this->super_SPxBasisBase<double>).thedesc.colstat.data[n]) {
  case P_FIXED:
    ::soplex::infinity::__tls_init();
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    uVar3 = SUB84(dVar1,0);
    uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = -dVar1;
    lVar2 = 0x670;
    ::soplex::infinity::__tls_init();
    goto LAB_001d895c;
  default:
    (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] =
         (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[n];
    dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[n];
    uVar3 = SUB84(dVar1,0);
    uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
    break;
  case P_ON_LOWER:
    ::soplex::infinity::__tls_init();
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = -*(double *)(in_FS_OFFSET + -8);
    uVar3 = 0;
    uVar4 = 0;
    goto LAB_001d890f;
  case P_ON_UPPER:
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = 0.0;
    ::soplex::infinity::__tls_init();
    uVar3 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
    uVar4 = (undefined4)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20);
LAB_001d890f:
    lVar2 = 0x670;
    goto LAB_001d895c;
  case P_FREE:
    (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = 0.0;
    uVar3 = 0;
    uVar4 = 0;
  }
  lVar2 = 0x688;
LAB_001d895c:
  *(ulong *)(*(long *)((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                              super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                              _vptr_ClassArray + lVar2) + (long)i * 8) = CONCAT44(uVar4,uVar3);
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBound4Col(int i, int n)
{

   assert(this->baseId(i).isSPxColId());
   assert(this->number(SPxColId(this->baseId(i))) == n);

   switch(this->desc().colStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = 0;
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = 0;
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FREE :
      theLBbound[i] = theUBbound[i] = 0;
      break;

   default:
      theUBbound[i] = SPxLPBase<R>::upper(n);
      theLBbound[i] = SPxLPBase<R>::lower(n);
      break;
   }
}